

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

double __thiscall
units::convert<units::unit,units::precise_unit>
          (units *this,double val,unit *start,precise_unit *result)

{
  uint uVar1;
  float fVar2;
  unit_data uVar3;
  bool bVar4;
  uint uVar5;
  unit_data uVar6;
  precise_unit *result_00;
  precise_unit *result_01;
  precise_unit *extraout_RDX;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double in_XMM1_Qa;
  double dVar9;
  ulong in_XMM1_Qb;
  unit_data base_result;
  unit local_40;
  double local_38;
  ulong uStack_30;
  unit local_28;
  
  bVar4 = precise_unit::operator==((precise_unit *)start,(unit *)this);
  if (bVar4) {
    return val;
  }
  uVar1 = *(uint *)(this + 4);
  if (*(float *)this == 1.0 && uVar1 == 0x30000000) {
    return val;
  }
  fVar2 = start[1].multiplier_;
  if ((double)*start == 1.0 && fVar2 == 4.656613e-10) {
    return val;
  }
  if ((((uVar1 | (uint)fVar2) >> 0x1e & 1) != 0) && ((((uint)fVar2 ^ uVar1) & 0xfffffff) == 0)) {
    in_XMM1_Qa = detail::convertFlaggedUnits<units::unit,units::precise_unit>
                           (val,(unit *)this,(precise_unit *)start,NAN);
    in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    if (!NAN(in_XMM1_Qa) && !NAN(in_XMM1_Qa)) {
      return in_XMM1_Qa;
    }
  }
  uVar6 = *(unit_data *)(this + 4);
  if (((int)uVar6 < 0) || (uVar3 = (unit_data)start[1].multiplier_, (int)uVar3 < 0)) {
    if ((((uint)start[1].multiplier_ ^ (uint)uVar6) & 0x307ffff) != 0) {
      return NAN;
    }
    local_40.multiplier_ = (float)uVar6;
    dVar9 = precise::equations::convert_equnit_to_value(val,(unit_data *)&local_40);
    local_40.multiplier_ = start[1].multiplier_;
    dVar9 = precise::equations::convert_value_to_equnit
                      ((dVar9 * (double)*(float *)this) / (double)*start,(unit_data *)&local_40);
    uVar7 = SUB84(dVar9,0);
    uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
LAB_00148989:
    dVar9 = (double)CONCAT44(uVar8,uVar7);
  }
  else {
    if (uVar3 == uVar6) {
      fVar2 = *(float *)this;
    }
    else {
      if ((((uint)uVar6 & (uint)uVar3) >> 0x1c & 1) == 0) {
        if ((((uint)uVar6 | (uint)uVar3) >> 0x1c & 1) != 0) {
          local_40 = *(unit *)this;
          local_28.base_units_ = uVar3;
          local_28.multiplier_ = (float)(double)*start;
          dVar9 = puconversion::assumedBase(&local_40,&local_28);
          if (NAN(dVar9)) {
            return NAN;
          }
          dVar9 = convert<units::unit,units::precise_unit>
                            (val,(unit *)this,(precise_unit *)start,dVar9);
          uVar7 = SUB84(dVar9,0);
          uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
          goto LAB_00148989;
        }
      }
      else {
        local_40 = *(unit *)this;
        local_38 = in_XMM1_Qa;
        uStack_30 = in_XMM1_Qb;
        bVar4 = unit::operator==(&local_40,(unit *)&pu);
        if (bVar4) {
          return val;
        }
        local_28.multiplier_ = (float)(double)*start;
        local_28.base_units_ = (unit_data)start[1].multiplier_;
        bVar4 = unit::operator==(&local_28,(unit *)&pu);
        if (bVar4) {
          return val;
        }
        local_40.multiplier_ = *(float *)(this + 4);
        local_28.multiplier_ = start[1].multiplier_;
        dVar9 = puconversion::knownConversions(val,(unit_data *)&local_40,(unit_data *)&local_28);
        in_XMM1_Qa = (double)(-(ulong)NAN(dVar9) & (ulong)local_38 |
                             ~-(ulong)NAN(dVar9) & (ulong)dVar9);
        in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) & uStack_30 |
                     ~CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) &
                     CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
        if (!NAN(dVar9) && !NAN(dVar9)) {
          return in_XMM1_Qa;
        }
      }
      uVar1 = *(uint *)(this + 4);
      local_40.multiplier_ = start[1].multiplier_;
      uVar5 = (uint)start[1].multiplier_ ^ uVar1;
      if ((uVar5 & 0xfffffff) != 0) {
        if ((uVar5 & 0x307ffff) == 0) {
          local_38 = in_XMM1_Qa;
          uStack_30 = in_XMM1_Qb;
          dVar9 = detail::convertCountingUnits<units::unit,units::precise_unit>
                            (val,(unit *)this,(precise_unit *)start);
          in_XMM1_Qa = (double)(-(ulong)NAN(dVar9) & (ulong)local_38 |
                               ~-(ulong)NAN(dVar9) & (ulong)dVar9);
          in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) & uStack_30 |
                       ~CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) &
                       CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
          if (!NAN(dVar9) && !NAN(dVar9)) {
            return in_XMM1_Qa;
          }
        }
        local_38 = in_XMM1_Qa;
        uStack_30 = in_XMM1_Qb;
        uVar6 = detail::unit_data::inv((unit_data *)&local_40);
        if ((((uint)uVar6 ^ uVar1) & 0xfffffff) == 0) {
          return 1.0 / ((double)*(float *)this * val * (double)*start);
        }
        if (((((byte)this[7] & 0x40) != 0) ||
            (result_01 = result_00, ((uint)start[1].multiplier_ & 0x40000000) != 0)) &&
           (dVar9 = detail::extraValidConversions<units::unit,units::precise_unit>
                              ((detail *)this,val,start,result_00), result_01 = extraout_RDX,
           !NAN(dVar9))) {
          return (double)(-(ulong)NAN(dVar9) & (ulong)local_38 | ~-(ulong)NAN(dVar9) & (ulong)dVar9)
          ;
        }
        dVar9 = detail::otherUsefulConversions<units::unit,units::precise_unit>
                          ((detail *)this,val,start,result_01);
        uVar7 = SUB84(dVar9,0);
        uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
        goto LAB_00148989;
      }
      fVar2 = *(float *)this;
    }
    dVar9 = ((double)fVar2 * val) / (double)*start;
  }
  return dVar9;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}